

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

fsg_link_t * fsg_arciter_get(fsg_arciter_t *itor)

{
  fsg_arciter_t *itor_local;
  
  if (itor->gn == (gnode_t *)0x0) {
    if (itor->null_itor == (hash_iter_t *)0x0) {
      itor_local = (fsg_arciter_t *)0x0;
    }
    else {
      itor_local = (fsg_arciter_t *)itor->null_itor->ent->val;
    }
  }
  else {
    itor_local = (fsg_arciter_t *)(itor->gn->data).ptr;
  }
  return (fsg_link_t *)itor_local;
}

Assistant:

fsg_link_t *
fsg_arciter_get(fsg_arciter_t * itor)
{
    /* Iterate over non-null arcs first. */
    if (itor->gn)
        return (fsg_link_t *) gnode_ptr(itor->gn);
    else if (itor->null_itor)
        return (fsg_link_t *) hash_entry_val(itor->null_itor->ent);
    else
        return NULL;
}